

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trw.cpp
# Opt level: O0

void __thiscall libDAI::TRW::calcNewMessage(TRW *this,size_t iI)

{
  bool bVar1;
  edge_type *peVar2;
  long *plVar3;
  undefined8 *puVar4;
  TFactor<double> *pTVar5;
  size_type sVar6;
  reference pVVar7;
  reference puVar8;
  VarSet *ns;
  undefined8 uVar9;
  VarSet *pVVar10;
  size_type in_RSI;
  long *in_RDI;
  size_t k;
  Var v_k;
  VarSet v_J;
  nb_cit J;
  Prob prod_j;
  Factor prod;
  size_t j;
  Var v_j;
  VarSet v_I;
  Var v_i;
  size_t I;
  size_t i;
  VarSet *in_stack_fffffffffffffbd8;
  FactorGraph *in_stack_fffffffffffffbe0;
  Var *in_stack_fffffffffffffbe8;
  TRW *in_stack_fffffffffffffbf0;
  VarSet *in_stack_fffffffffffffbf8;
  TRW *in_stack_fffffffffffffc00;
  size_t in_stack_fffffffffffffc08;
  allocator<char> *in_stack_fffffffffffffc10;
  Exception *in_stack_fffffffffffffc18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc20;
  TFactor<double> *in_stack_fffffffffffffc28;
  Exception *in_stack_fffffffffffffc30;
  TFactor<double> *in_stack_fffffffffffffc38;
  undefined1 normed;
  TFactor<double> *in_stack_fffffffffffffc40;
  TFactor<double> *in_stack_fffffffffffffc48;
  iterator in_stack_fffffffffffffc50;
  size_t in_stack_fffffffffffffc58;
  Exception *in_stack_fffffffffffffc60;
  VarSet *in_stack_fffffffffffffc70;
  VarSet *in_stack_fffffffffffffc78;
  TFactor<double> local_298 [2];
  unsigned_long *local_208;
  undefined1 local_1fa;
  TFactor<double> *local_1a8;
  __normal_iterator<libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
  local_160;
  long local_158;
  size_t sStack_150;
  unsigned_long *local_128;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_120 [11];
  Exception *local_c8;
  __normal_iterator<libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_> local_80
  ;
  Var local_78 [4];
  undefined8 local_38;
  undefined8 uStack_30;
  unsigned_long local_20;
  unsigned_long local_18;
  size_type local_10;
  
  local_10 = in_RSI;
  (**(code **)(*in_RDI + 0x28))();
  peVar2 = FactorGraph::edge(in_stack_fffffffffffffbe0,(size_t)in_stack_fffffffffffffbd8);
  local_18 = peVar2->first;
  (**(code **)(*in_RDI + 0x28))();
  peVar2 = FactorGraph::edge(in_stack_fffffffffffffbe0,(size_t)in_stack_fffffffffffffbd8);
  local_20 = peVar2->second;
  plVar3 = (long *)(**(code **)(*in_RDI + 0x28))();
  puVar4 = (undefined8 *)(**(code **)(*plVar3 + 0x30))(plVar3,local_18);
  local_38 = *puVar4;
  uStack_30 = puVar4[1];
  plVar3 = (long *)(**(code **)(*in_RDI + 0x28))();
  pTVar5 = (TFactor<double> *)(**(code **)(*plVar3 + 0x50))(plVar3,local_20);
  TFactor<double>::vars(pTVar5);
  VarSet::VarSet((VarSet *)in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
  sVar6 = VarSet::size((VarSet *)0xba2e7c);
  if (sVar6 == 1) {
    plVar3 = (long *)(**(code **)(*in_RDI + 0x28))();
    pTVar5 = (TFactor<double> *)(**(code **)(*plVar3 + 0x50))(plVar3,local_20);
    TFactor<double>::p(pTVar5);
    std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>::operator[]
              ((vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_> *)
               (in_RDI + 0x2f),local_10);
    TProb<double>::operator=
              ((TProb<double> *)in_stack_fffffffffffffbe0,(TProb<double> *)in_stack_fffffffffffffbd8
              );
  }
  else {
    sVar6 = VarSet::size((VarSet *)0xba2f46);
    if (sVar6 != 2) {
      uVar9 = __cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffc20,(char *)in_stack_fffffffffffffc18,
                 in_stack_fffffffffffffc10);
      Exception::Exception
                (in_stack_fffffffffffffc60,in_stack_fffffffffffffc58,
                 (string *)in_stack_fffffffffffffc50._M_current);
      __cxa_throw(uVar9,&Exception::typeinfo,Exception::~Exception);
    }
    VarSet::VarSet((VarSet *)in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
    VarSet::operator/(in_stack_fffffffffffffc78,in_stack_fffffffffffffc70);
    local_80._M_current = (Var *)VarSet::begin(in_stack_fffffffffffffbd8);
    pVVar7 = __gnu_cxx::
             __normal_iterator<libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
             ::operator*(&local_80);
    local_78[0]._label = pVVar7->_label;
    local_78[0]._states = pVVar7->_states;
    VarSet::~VarSet((VarSet *)0xba2fe6);
    VarSet::~VarSet((VarSet *)0xba2ff3);
    plVar3 = (long *)(**(code **)(*in_RDI + 0x28))();
    local_c8 = (Exception *)(**(code **)(*plVar3 + 0x40))(plVar3,local_78);
    plVar3 = (long *)(**(code **)(*in_RDI + 0x28))();
    (**(code **)(*plVar3 + 0x50))(plVar3,local_20);
    rho(in_stack_fffffffffffffc00,(size_t)in_stack_fffffffffffffbf8,
        (size_t)in_stack_fffffffffffffbf0);
    TFactor<double>::operator^(in_stack_fffffffffffffc28,(Real)in_stack_fffffffffffffc20);
    Var::states(local_78);
    TProb<double>::TProb((TProb<double> *)in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
    (**(code **)(*in_RDI + 0x28))();
    FactorGraph::nbV(in_stack_fffffffffffffbe0,(size_t)in_stack_fffffffffffffbd8);
    local_120[0]._M_current =
         (unsigned_long *)
         std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                   ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                    in_stack_fffffffffffffbd8);
    while( true ) {
      (**(code **)(*in_RDI + 0x28))();
      FactorGraph::nbV(in_stack_fffffffffffffbe0,(size_t)in_stack_fffffffffffffbd8);
      local_128 = (unsigned_long *)
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             in_stack_fffffffffffffbd8);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          *)in_stack_fffffffffffffbe0,
                         (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          *)in_stack_fffffffffffffbd8);
      if (!bVar1) break;
      plVar3 = (long *)(**(code **)(*in_RDI + 0x28))();
      puVar8 = __gnu_cxx::
               __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*(local_120);
      pTVar5 = (TFactor<double> *)(**(code **)(*plVar3 + 0x50))(plVar3,*puVar8);
      pVVar10 = TFactor<double>::vars(pTVar5);
      VarSet::VarSet((VarSet *)in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
      ns = (VarSet *)VarSet::size((VarSet *)0xba3241);
      if (ns == (VarSet *)0x1) {
        in_stack_fffffffffffffc60 = local_c8;
        __gnu_cxx::
        __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
        ::operator*(local_120);
        message(in_stack_fffffffffffffbf0,(size_t)in_stack_fffffffffffffbe8,
                (size_t)in_stack_fffffffffffffbe0);
        TProb<double>::operator*=
                  ((TProb<double> *)in_stack_fffffffffffffc00,
                   (TProb<double> *)in_stack_fffffffffffffbf8);
      }
      else {
        sVar6 = VarSet::size((VarSet *)0xba3359);
        if (sVar6 != 2) {
          local_1fa = 1;
          uVar9 = __cxa_allocate_exception(0x10);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffc20,(char *)in_stack_fffffffffffffc18,
                     in_stack_fffffffffffffc10);
          Exception::Exception
                    (in_stack_fffffffffffffc60,sVar6,(string *)in_stack_fffffffffffffc50._M_current)
          ;
          local_1fa = 0;
          __cxa_throw(uVar9,&Exception::typeinfo,Exception::~Exception);
        }
        VarSet::VarSet((VarSet *)in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
        VarSet::operator/(pVVar10,ns);
        in_stack_fffffffffffffc50 = VarSet::begin(in_stack_fffffffffffffbd8);
        local_160._M_current = in_stack_fffffffffffffc50._M_current;
        pVVar7 = __gnu_cxx::
                 __normal_iterator<libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
                 ::operator*(&local_160);
        local_158 = pVVar7->_label;
        sStack_150 = pVVar7->_states;
        VarSet::~VarSet((VarSet *)0xba33f3);
        VarSet::~VarSet((VarSet *)0xba3400);
        in_stack_fffffffffffffc48 = (TFactor<double> *)(**(code **)(*in_RDI + 0x28))();
        in_stack_fffffffffffffc40 =
             (TFactor<double> *)
             (*(code *)(in_stack_fffffffffffffc48->_vs)._vars.
                       super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                       super__Vector_impl_data._M_start[4]._label)
                       (in_stack_fffffffffffffc48,&local_158);
        local_1a8 = in_stack_fffffffffffffc40;
        puVar8 = __gnu_cxx::
                 __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                 ::operator*(local_120);
        if (*puVar8 == local_20) {
          in_stack_fffffffffffffc30 = local_c8;
          __gnu_cxx::
          __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          ::operator*(local_120);
          in_stack_fffffffffffffc38 =
               (TFactor<double> *)
               message(in_stack_fffffffffffffbf0,(size_t)in_stack_fffffffffffffbe8,
                       (size_t)in_stack_fffffffffffffbe0);
          rho(in_stack_fffffffffffffc00,(size_t)in_stack_fffffffffffffbf8,
              (size_t)in_stack_fffffffffffffbf0);
          TProb<double>::operator^
                    ((TProb<double> *)in_stack_fffffffffffffc38,(Real)in_stack_fffffffffffffc30);
          TProb<double>::operator*=
                    ((TProb<double> *)in_stack_fffffffffffffc00,
                     (TProb<double> *)in_stack_fffffffffffffbf8);
          TProb<double>::~TProb((TProb<double> *)0xba3505);
        }
        else {
          in_stack_fffffffffffffc18 = local_c8;
          __gnu_cxx::
          __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          ::operator*(local_120);
          in_stack_fffffffffffffc20 =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               message(in_stack_fffffffffffffbf0,(size_t)in_stack_fffffffffffffbe8,
                       (size_t)in_stack_fffffffffffffbe0);
          in_stack_fffffffffffffc10 =
               (allocator<char> *)
               rho(in_stack_fffffffffffffc00,(size_t)in_stack_fffffffffffffbf8,
                   (size_t)in_stack_fffffffffffffbf0);
          TProb<double>::operator^
                    ((TProb<double> *)in_stack_fffffffffffffc38,(Real)in_stack_fffffffffffffc30);
          TProb<double>::operator*=
                    ((TProb<double> *)in_stack_fffffffffffffc00,
                     (TProb<double> *)in_stack_fffffffffffffbf8);
          TProb<double>::~TProb((TProb<double> *)0xba3612);
        }
      }
      VarSet::~VarSet((VarSet *)0xba372b);
      local_208 = (unsigned_long *)
                  __gnu_cxx::
                  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  ::operator++((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                *)in_stack_fffffffffffffbe8,
                               (int)((ulong)in_stack_fffffffffffffbe0 >> 0x20));
    }
    VarSet::VarSet((VarSet *)in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
    TFactor<double>::TFactor
              ((TFactor<double> *)in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,
               (TProb<double> *)in_stack_fffffffffffffbf0);
    TFactor<double>::operator*=(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
    normed = (undefined1)((ulong)in_stack_fffffffffffffc38 >> 0x38);
    TFactor<double>::~TFactor((TFactor<double> *)in_stack_fffffffffffffbe0);
    VarSet::~VarSet((VarSet *)0xba37c0);
    plVar3 = (long *)(**(code **)(*in_RDI + 0x28))();
    pVVar10 = (VarSet *)(**(code **)(*plVar3 + 0x30))(plVar3,local_18);
    VarSet::VarSet(pVVar10,in_stack_fffffffffffffbe8);
    TFactor<double>::marginal
              (in_stack_fffffffffffffc48,&in_stack_fffffffffffffc40->_vs,(bool)normed);
    TFactor<double>::p(local_298);
    std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>::operator[]
              ((vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_> *)
               (in_RDI + 0x2f),local_10);
    TProb<double>::operator=
              ((TProb<double> *)in_stack_fffffffffffffbe0,(TProb<double> *)in_stack_fffffffffffffbd8
              );
    TFactor<double>::~TFactor((TFactor<double> *)in_stack_fffffffffffffbe0);
    VarSet::~VarSet((VarSet *)0xba3886);
    TProb<double>::~TProb((TProb<double> *)0xba3893);
    TFactor<double>::~TFactor((TFactor<double> *)in_stack_fffffffffffffbe0);
  }
  VarSet::~VarSet((VarSet *)0xba3a36);
  return;
}

Assistant:

void TRW::calcNewMessage (size_t iI) {
        // calculate updated message I->i
        size_t i = grm().edge(iI).first;
        size_t I = grm().edge(iI).second;
        Var v_i = grm().var(i);

        VarSet v_I = grm().factor(I).vars();
        if( v_I.size() == 1 ) {
            _newmessages[iI] = grm().factor(I).p();
        } else if( v_I.size() == 2 ) {
            Var v_j = *((v_I / v_i).begin());
            size_t j = grm().findVar( v_j );

            Factor prod = grm().factor(I)^(1.0 / rho(i,j));

            Prob prod_j( v_j.states() );
            for( FactorGraph::nb_cit J = grm().nbV(j).begin(); J != grm().nbV(j).end(); J++ ) {
                VarSet v_J = grm().factor(*J).vars();
                if( v_J.size() == 1 )
                    prod_j *= message(j,*J);
                else if( v_J.size() == 2 ) {
                    Var v_k = *((v_J / v_j).begin());
                    size_t k = grm().findVar( v_k );
                    if( *J == I )
                        prod_j *= message(j,*J)^(rho(j,k) - 1.0);
                    else
                        prod_j *= message(j,*J)^rho(j,k);
                } else
                    DAI_THROW(NOT_IMPLEMENTED);
            }
            prod *= Factor( v_j, prod_j );

            _newmessages[iI] = prod.marginal(grm().var(i)).p();
        } else
            DAI_THROW(NOT_IMPLEMENTED);
    }